

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_setup_connection(connectdata *conn)

{
  undefined1 *puVar1;
  Curl_easy *pCVar2;
  char cVar3;
  CURLcode CVar4;
  undefined8 *puVar5;
  ulong uVar6;
  char *pcVar7;
  
  pCVar2 = conn->data;
  puVar5 = (undefined8 *)(*Curl_ccalloc)(0x20,1);
  (conn->data->req).protop = puVar5;
  if (puVar5 == (undefined8 *)0x0) {
    CVar4 = CURLE_OUT_OF_MEMORY;
  }
  else {
    pcVar7 = (pCVar2->state).up.path + 1;
    *puVar5 = pcVar7;
    pcVar7 = strstr(pcVar7,";type=");
    if (pcVar7 == (char *)0x0) {
      pcVar7 = strstr((conn->host).rawalloc,";type=");
    }
    if (pcVar7 != (char *)0x0) {
      *pcVar7 = '\0';
      cVar3 = Curl_raw_toupper(pcVar7[6]);
      puVar1 = &(conn->bits).field_0x7;
      *puVar1 = *puVar1 | 4;
      uVar6 = *(ulong *)&(pCVar2->set).field_0x8e8;
      if (cVar3 == 'D') {
        uVar6 = uVar6 | 0x2000;
      }
      else if (cVar3 == 'A') {
        uVar6 = uVar6 | 0x800;
      }
      else {
        uVar6 = uVar6 & 0xfffffffffffff7ff;
      }
      *(ulong *)&(pCVar2->set).field_0x8e8 = uVar6;
    }
    *(undefined4 *)(puVar5 + 2) = 0;
    puVar5[3] = 0;
    (conn->proto).ftpc.known_filesize = -1;
    CVar4 = CURLE_OK;
  }
  return CVar4;
}

Assistant:

static CURLcode ftp_setup_connection(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  char *type;
  struct FTP *ftp;

  conn->data->req.protop = ftp = calloc(sizeof(struct FTP), 1);
  if(NULL == ftp)
    return CURLE_OUT_OF_MEMORY;

  ftp->path = &data->state.up.path[1]; /* don't include the initial slash */

  /* FTP URLs support an extension like ";type=<typecode>" that
   * we'll try to get now! */
  type = strstr(ftp->path, ";type=");

  if(!type)
    type = strstr(conn->host.rawalloc, ";type=");

  if(type) {
    char command;
    *type = 0;                     /* it was in the middle of the hostname */
    command = Curl_raw_toupper(type[6]);
    conn->bits.type_set = TRUE;

    switch(command) {
    case 'A': /* ASCII mode */
      data->set.prefer_ascii = TRUE;
      break;

    case 'D': /* directory mode */
      data->set.ftp_list_only = TRUE;
      break;

    case 'I': /* binary mode */
    default:
      /* switch off ASCII */
      data->set.prefer_ascii = FALSE;
      break;
    }
  }

  /* get some initial data into the ftp struct */
  ftp->transfer = FTPTRANSFER_BODY;
  ftp->downloadsize = 0;
  conn->proto.ftpc.known_filesize = -1; /* unknown size for now */

  return CURLE_OK;
}